

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall
glslang::HlslGrammar::acceptLayoutQualifierList(HlslGrammar *this,TQualifier *qualifier)

{
  bool bVar1;
  TIntermTyped *local_50;
  TIntermTyped *expr;
  HlslToken idToken;
  TQualifier *qualifier_local;
  HlslGrammar *this_local;
  
  idToken.field_2 = (anon_union_8_5_54ae9b2d_for_HlslToken_2)qualifier;
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLayout);
  if (bVar1) {
    bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
    if (bVar1) {
      do {
        HlslToken::HlslToken((HlslToken *)&expr);
        bVar1 = acceptIdentifier(this,(HlslToken *)&expr);
        if (!bVar1) break;
        bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokAssign);
        if (bVar1) {
          bVar1 = acceptConditionalExpression(this,&local_50);
          if (!bVar1) {
            expected(this,"expression");
            return false;
          }
          HlslParseContext::setLayoutQualifier
                    (this->parseContext,(TSourceLoc *)&expr,(TQualifier *)idToken.field_2.string,
                     (TString *)idToken._24_8_,local_50);
        }
        else {
          HlslParseContext::setLayoutQualifier
                    (this->parseContext,(TSourceLoc *)&expr,(TQualifier *)idToken.field_2.string,
                     (TString *)idToken._24_8_);
        }
        bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma);
      } while (bVar1);
      bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        expected(this,")");
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptLayoutQualifierList(TQualifier& qualifier)
{
    if (! acceptTokenClass(EHTokLayout))
        return false;

    // LEFT_PAREN
    if (! acceptTokenClass(EHTokLeftParen))
        return false;

    do {
        // identifier
        HlslToken idToken;
        if (! acceptIdentifier(idToken))
            break;

        // EQUAL expression
        if (acceptTokenClass(EHTokAssign)) {
            TIntermTyped* expr;
            if (! acceptConditionalExpression(expr)) {
                expected("expression");
                return false;
            }
            parseContext.setLayoutQualifier(idToken.loc, qualifier, *idToken.string, expr);
        } else
            parseContext.setLayoutQualifier(idToken.loc, qualifier, *idToken.string);

        // COMMA
        if (! acceptTokenClass(EHTokComma))
            break;
    } while (true);

    // RIGHT_PAREN
    if (! acceptTokenClass(EHTokRightParen)) {
        expected(")");
        return false;
    }

    return true;
}